

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.h
# Opt level: O2

void __thiscall FIX::Trailer::Trailer(Trailer *this)

{
  message_order local_28;
  
  local_28.m_mode = trailer;
  local_28._4_8_ = 0;
  local_28.m_groupOrder._4_8_ = 0;
  local_28._20_8_ = 0;
  FieldMap::FieldMap(&this->super_FieldMap,&local_28,1);
  shared_array<int>::~shared_array(&local_28.m_groupOrder);
  (this->super_FieldMap)._vptr_FieldMap = (_func_int **)&PTR__FieldMap_001fd4a8;
  return;
}

Assistant:

Trailer()
      : FieldMap(message_order(message_order::trailer), REQUIRED_FIELDS) {}